

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

char * X86_reg_name(csh handle,uint reg)

{
  if (0xe9 < reg) {
    return (char *)0x0;
  }
  if (reg == 0x19) {
    if ((*(uint *)(handle + 4) & 4) != 0) {
      return "eflags";
    }
    if ((*(uint *)(handle + 4) & 8) != 0) {
      return "rflags";
    }
  }
  return reg_name_maps[reg].name;
}

Assistant:

const char *X86_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	cs_struct *ud = (cs_struct *)handle;

	if (reg >= X86_REG_ENDING)
		return NULL;

	if (reg == X86_REG_EFLAGS) {
		if (ud->mode & CS_MODE_32)
			return "eflags";
		if (ud->mode & CS_MODE_64)
			return "rflags";
	}

	return reg_name_maps[reg].name;
#else
	return NULL;
#endif
}